

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_3> * __thiscall
tcu::cross<double,3>
          (Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *a,
          Vector<double,_3> *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector<double,_3> *b_local;
  Vector<double,_3> *a_local;
  
  dVar1 = Vector<double,_3>::y((Vector<double,_3> *)this);
  dVar2 = Vector<double,_3>::z(a);
  dVar3 = Vector<double,_3>::y(a);
  dVar4 = Vector<double,_3>::z((Vector<double,_3> *)this);
  dVar5 = Vector<double,_3>::z((Vector<double,_3> *)this);
  dVar6 = Vector<double,_3>::x(a);
  dVar7 = Vector<double,_3>::z(a);
  dVar8 = Vector<double,_3>::x((Vector<double,_3> *)this);
  dVar9 = Vector<double,_3>::x((Vector<double,_3> *)this);
  dVar10 = Vector<double,_3>::y(a);
  dVar11 = Vector<double,_3>::x(a);
  dVar12 = Vector<double,_3>::y((Vector<double,_3> *)this);
  Vector<double,_3>::Vector
            (__return_storage_ptr__,dVar1 * dVar2 + -(dVar3 * dVar4),
             dVar5 * dVar6 + -(dVar7 * dVar8),dVar9 * dVar10 + -(dVar11 * dVar12));
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> cross (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	DE_STATIC_ASSERT(Size == 3);
	return Vector<T, Size>(
		a.y() * b.z() - b.y() * a.z(),
		a.z() * b.x() - b.z() * a.x(),
		a.x() * b.y() - b.x() * a.y());
}